

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.hpp
# Opt level: O0

void __thiscall
InstructionSet::x86::Decoder<(InstructionSet::x86::Model)2>::reset_parsing
          (Decoder<(InstructionSet::x86::Model)2> *this)

{
  ScaleIndexBase local_11;
  Decoder<(InstructionSet::x86::Model)2> *local_10;
  Decoder<(InstructionSet::x86::Model)2> *this_local;
  
  this->operand_bytes_ = 0;
  this->consumed_ = 0;
  this->operation_size_ = None;
  this->operand_size_ = None;
  this->displacement_size_ = None;
  this->operand_ = 0;
  this->displacement_ = 0;
  this->lock_ = false;
  this->address_size_ = this->default_address_size_;
  this->data_size_ = this->default_data_size_;
  this->segment_override_ = None;
  this->repetition_ = None;
  this->phase_ = Instruction;
  this->destination_ = None;
  this->source_ = None;
  local_10 = this;
  ScaleIndexBase::ScaleIndexBase(&local_11);
  (this->sib_).sib_ = local_11.sib_;
  this->next_inward_data_shift_ = 0;
  this->inward_data_ = 0;
  this->sign_extend_operand_ = false;
  this->sign_extend_displacement_ = true;
  return;
}

Assistant:

void reset_parsing() {
			consumed_ = operand_bytes_ = 0;
			displacement_size_ = operand_size_ = operation_size_ = DataSize::None;
			displacement_ = operand_ = 0;
			lock_ = false;
			address_size_ = default_address_size_;
			data_size_ = default_data_size_;
			segment_override_ = Source::None;
			repetition_ = Repetition::None;
			phase_ = Phase::Instruction;
			source_ = destination_ = Source::None;
			sib_ = ScaleIndexBase();
			next_inward_data_shift_ = 0;
			inward_data_ = 0;
			sign_extend_operand_ = false;
			sign_extend_displacement_ = true;
		}